

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O2

void __thiscall
IntrusiveList<FunctionHandle>::push_back(IntrusiveList<FunctionHandle> *this,FunctionHandle *node)

{
  uint __line;
  FunctionHandle *pFVar1;
  char *__assertion;
  bool bVar2;
  
  if (node == (FunctionHandle *)0x0) {
    __assertion = "node";
    __line = 0xf;
  }
  else if (node->next == (FunctionHandle *)0x0) {
    if (node->listed != true) {
      node->listed = true;
      bVar2 = this->head != (FunctionHandle *)0x0;
      pFVar1 = (FunctionHandle *)this;
      if (bVar2) {
        pFVar1 = this->tail;
      }
      pFVar1->next = node;
      (&this->head)[bVar2] = node;
      return;
    }
    __assertion = "!node->listed";
    __line = 0x11;
  }
  else {
    __assertion = "node->next == 0";
    __line = 0x10;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,__line,"void IntrusiveList<FunctionHandle>::push_back(T *) [T = FunctionHandle]");
}

Assistant:

void push_back(T *node)
	{
		assert(node);
		assert(node->next == 0);
		assert(!node->listed);

		node->listed = true;

		if(!head)
		{
			head = tail = node;
		}
		else
		{
			tail->next = node;
			tail = node;
		}
	}